

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tctok.cpp
# Opt level: O0

void __thiscall CTcTokenizer::pop_if(CTcTokenizer *this)

{
  CTcTokenizer *this_local;
  
  if (this->if_false_level_ != 0) {
    this->if_false_level_ = this->if_false_level_ + -1;
  }
  if (this->if_sp_ != 0) {
    this->if_sp_ = this->if_sp_ + -1;
  }
  return;
}

Assistant:

void CTcTokenizer::pop_if()
{
    /* if we're in a nested #if in a false #if, pop the nesting level */
    if (if_false_level_ != 0)
        --if_false_level_;

    /* pop the main if level */
    if (if_sp_ != 0)
        --if_sp_;
}